

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,QByteArray *array)

{
  long lVar1;
  bool bVar2;
  QTextStreamPrivate *this_00;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  qsizetype length;
  QChar *ptr;
  undefined4 in_stack_ffffffffffffff68;
  Status in_stack_ffffffffffffff6c;
  QTextStreamPrivate *in_stack_ffffffffffffff70;
  QTextStream *local_68;
  undefined8 in_stack_ffffffffffffffc8;
  TokenDelimiter delimiter;
  qsizetype in_stack_ffffffffffffffd0;
  qsizetype *in_stack_ffffffffffffffd8;
  QChar **in_stack_ffffffffffffffe0;
  QTextStreamPrivate *in_stack_ffffffffffffffe8;
  
  delimiter = (TokenDelimiter)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextStream *)0x4ab4a5);
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QMessageLogger::warning((QMessageLogger *)&stack0xffffffffffffffd8,"QTextStream: No device");
    local_68 = in_RDI;
  }
  else {
    QTextStreamPrivate::scan
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0,delimiter);
    QTextStreamPrivate::consumeLastToken(in_stack_ffffffffffffff70);
    bVar2 = QTextStreamPrivate::scan
                      (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8
                       ,-0x5555555555555556,0xaaaaaaaa);
    if (bVar2) {
      QStringView::QStringView<QChar,_true>
                ((QStringView *)this_00,(QChar *)in_RDI,(qsizetype)in_stack_ffffffffffffff70);
      QStringView::toUtf8((QStringView *)in_stack_ffffffffffffff70);
      QByteArray::operator=
                ((QByteArray *)in_stack_ffffffffffffff70,
                 (QByteArray *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      QByteArray::~QByteArray((QByteArray *)0x4ab5ba);
      QTextStreamPrivate::consumeLastToken(in_stack_ffffffffffffff70);
      local_68 = in_RDI;
    }
    else {
      setStatus((QTextStream *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      QByteArray::clear((QByteArray *)0x4ab572);
      local_68 = in_RDI;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_68;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(QByteArray &array)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);

    d->scan(nullptr, nullptr, 0, QTextStreamPrivate::NotSpace);
    d->consumeLastToken();

    const QChar *ptr;
    qsizetype length;
    if (!d->scan(&ptr, &length, 0, QTextStreamPrivate::Space)) {
        setStatus(ReadPastEnd);
        array.clear();
        return *this;
    }

    array = QStringView(ptr, length).toUtf8();

    d->consumeLastToken();
    return *this;
}